

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CentralizedFileFormat.cpp
# Opt level: O0

JSONNode __thiscall ser::CentralizedFileFormat::GlobalInfoToJSON(CentralizedFileFormat *this)

{
  bool bVar1;
  reference child;
  long in_RSI;
  __normal_iterator<const_JSONNode_*,_std::vector<JSONNode,_std::allocator<JSONNode>_>_> local_88;
  __normal_iterator<const_JSONNode_*,_std::vector<JSONNode,_std::allocator<JSONNode>_>_> local_80;
  const_iterator iter;
  vector<JSONNode,_std::allocator<JSONNode>_> *nodes;
  allocator local_41;
  json_string local_40;
  byte local_19;
  CentralizedFileFormat *this_local;
  JSONNode *node;
  
  local_19 = 0;
  this_local = this;
  ::JSONNode::JSONNode((JSONNode *)this,'\x05');
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_40,"GlobalMetainfo",&local_41);
  ::JSONNode::set_name((JSONNode *)this,&local_40);
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator((allocator<char> *)&local_41);
  MetainfoSet::GenerateNodes
            ((vector<JSONNode,_std::allocator<JSONNode>_> *)&iter,*(MetainfoSet **)(in_RSI + 0x58));
  local_80._M_current =
       (JSONNode *)
       std::vector<JSONNode,_std::allocator<JSONNode>_>::begin
                 ((vector<JSONNode,_std::allocator<JSONNode>_> *)&iter);
  while( true ) {
    local_88._M_current =
         (JSONNode *)
         std::vector<JSONNode,_std::allocator<JSONNode>_>::end
                   ((vector<JSONNode,_std::allocator<JSONNode>_> *)&iter);
    bVar1 = __gnu_cxx::operator!=(&local_80,&local_88);
    if (!bVar1) break;
    child = __gnu_cxx::
            __normal_iterator<const_JSONNode_*,_std::vector<JSONNode,_std::allocator<JSONNode>_>_>::
            operator*(&local_80);
    ::JSONNode::push_back((JSONNode *)this,child);
    __gnu_cxx::
    __normal_iterator<const_JSONNode_*,_std::vector<JSONNode,_std::allocator<JSONNode>_>_>::
    operator++(&local_80);
  }
  local_19 = 1;
  std::vector<JSONNode,_std::allocator<JSONNode>_>::~vector
            ((vector<JSONNode,_std::allocator<JSONNode>_> *)&iter);
  if ((local_19 & 1) == 0) {
    ::JSONNode::~JSONNode((JSONNode *)this);
  }
  return (JSONNode)(internalJSONNode *)this;
}

Assistant:

JSONNode CentralizedFileFormat::GlobalInfoToJSON() const
{
    JSONNode node;
    node.set_name("GlobalMetainfo");

    const std::vector<JSONNode>& nodes = pGlobalMetainfo_->GenerateNodes();
    for (std::vector<JSONNode>::const_iterator iter = nodes.begin(); iter != nodes.end(); ++iter)
        node.push_back(*iter);

    return node;
}